

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O3

UINT8 device_start_saa1099_vb(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  undefined1 auVar2 [16];
  UINT8 UVar3;
  DEV_DATA DVar4;
  long lVar5;
  SAA_CHIP *saa;
  uint uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  
  uVar1 = cfg->clock;
  uVar6 = uVar1 >> 7;
  if (cfg->srMode == '\x02') {
    if (uVar6 <= cfg->smplRate) {
      uVar6 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar6 = cfg->smplRate;
  }
  DVar4.chipInf = calloc(1,0x110);
  if ((DEV_DATA *)DVar4.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(uint *)((long)DVar4.chipInf + 0x10c) = uVar1;
    *(uint *)&((DEV_DATA *)((long)DVar4.chipInf + 0x108))->chipInf = uVar6;
    ((DEV_DATA *)((long)DVar4.chipInf + 0xf8))->chipInf =
         (void *)(CONCAT44(uVar1,(uVar6 << 7) >> 1) / (ulong)(uVar6 << 7));
    *(undefined8 *)((long)DVar4.chipInf + 0xb4) = 0x15500000000;
    *(undefined8 *)((long)DVar4.chipInf + 0xbc) = 0x400000002aa;
    *(undefined8 *)((long)DVar4.chipInf + 0xc4) = 0x6aa00000555;
    *(undefined8 *)((long)DVar4.chipInf + 0xcc) = 0x95500000800;
    *(undefined8 *)((long)DVar4.chipInf + 0xd4) = 0xc0000000aaa;
    *(undefined8 *)((long)DVar4.chipInf + 0xdc) = 0xeaa00000d55;
    *(undefined8 *)((long)DVar4.chipInf + 0xe4) = 0x115500001000;
    *(undefined8 *)((long)DVar4.chipInf + 0xec) = 0x1400000012aa;
    auVar2 = _DAT_001733d0;
    lVar5 = 0x23;
    auVar7 = _DAT_001733c0;
    do {
      if (SUB164(auVar7 ^ auVar2,4) == -0x80000000 && SUB164(auVar7 ^ auVar2,0) < -0x7ffffffa) {
        *(undefined1 *)((long)DVar4.chipInf + lVar5 + -0xe) = 0;
        *(undefined1 *)((long)DVar4.chipInf + lVar5) = 0;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x1c;
    } while (lVar5 != 0x77);
    *(void **)DVar4.chipInf = DVar4.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = uVar6;
    retDevInf->devDef = &devDef_SAA1099_VB;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_saa1099_vb(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099v_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_VB);
	return 0x00;
}